

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_want_write(nghttp2_session *session)

{
  int iVar1;
  byte local_1a;
  byte local_19;
  nghttp2_session *session_local;
  
  if ((session->goaway_flags & 2) == 0) {
    local_19 = 1;
    if (((((session->aob).item == (nghttp2_outbound_item *)0x0) &&
         (local_19 = 1, (session->ob_urgent).head == (nghttp2_outbound_item *)0x0)) &&
        (local_19 = 1, (session->ob_reg).head == (nghttp2_outbound_item *)0x0)) &&
       (((iVar1 = nghttp2_pq_empty(&(session->root).obq), iVar1 != 0 &&
         (iVar1 = session_sched_empty(session), iVar1 != 0)) ||
        (local_19 = 1, session->remote_window_size < 1)))) {
      local_1a = 0;
      if ((session->ob_syn).head != (nghttp2_outbound_item *)0x0) {
        iVar1 = session_is_outgoing_concurrent_streams_max(session);
        local_1a = iVar1 != 0 ^ 0xff;
      }
      local_19 = local_1a;
    }
    return (uint)(local_19 & 1);
  }
  return 0;
}

Assistant:

int nghttp2_session_want_write(nghttp2_session *session) {
  /* If these flag is set, we don't want to write any data. The
     application should drop the connection. */
  if (session->goaway_flags & NGHTTP2_GOAWAY_TERM_SENT) {
    return 0;
  }

  /*
   * Unless termination GOAWAY is sent or received, we want to write
   * frames if there is pending ones. If pending frame is request/push
   * response HEADERS and concurrent stream limit is reached, we don't
   * want to write them.
   */
  return session->aob.item || nghttp2_outbound_queue_top(&session->ob_urgent) ||
         nghttp2_outbound_queue_top(&session->ob_reg) ||
         ((!nghttp2_pq_empty(&session->root.obq) ||
           !session_sched_empty(session)) &&
          session->remote_window_size > 0) ||
         (nghttp2_outbound_queue_top(&session->ob_syn) &&
          !session_is_outgoing_concurrent_streams_max(session));
}